

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-tool.cc
# Opt level: O1

void __thiscall string_parser::do_read(string_parser *this,bool append,bool null_term)

{
  ssize_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  int *piVar2;
  char *__rhs;
  ulong __offset;
  bool bVar3;
  char c;
  char local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __offset = this->_offset;
  if (__offset < this->_end) {
    do {
      sVar1 = pread(this->_fd,&local_51,1,__offset);
      if ((int)sVar1 != 1) {
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"read failed: ","");
        piVar2 = __errno_location();
        __rhs = strerror(*piVar2);
        std::operator+(__return_storage_ptr__,&local_50,__rhs);
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
      bVar3 = (local_51 != '\0') == null_term;
      if (!bVar3 && append) {
        std::__cxx11::string::push_back((char)this + '(');
      }
      if (bVar3) {
        return;
      }
      __offset = this->_offset + 1;
      this->_offset = __offset;
    } while (__offset < this->_end);
  }
  return;
}

Assistant:

void do_read(bool append, bool null_term)
	{
		// std::cout << "READ: @" << std::hex << _offset << " append " << append << " null_term " << null_term << "\n";
		for (;_offset < _end; _offset++) {
			char c;
			int r = pread(_fd, &c, 1, _offset);
			if (r != 1)
				throw std::string("read failed: ") + strerror(errno);

			// std::cout << "READ: " << (isprint(c) ? c : '.') << " " << int(c) << " @" << std::hex << _offset <<"\n";

			if ((c == '\0') ^ null_term)
				return;

			if (append)
				_str += c;
		}
	}